

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VGetVectorID(N_Vector X,N_Vector_ID ID,int myid)

{
  N_Vector_ID NVar1;
  int myid_local;
  N_Vector_ID ID_local;
  N_Vector X_local;
  
  NVar1 = N_VGetVectorID(X);
  if (NVar1 == ID) {
    if (myid == 0) {
      printf("PASSED test -- N_VGetVectorID \n");
    }
    X_local._4_4_ = 0;
  }
  else {
    printf(">>> FAILED test -- N_VGetVectorID, Proc %d \n",(ulong)(uint)myid);
    NVar1 = N_VGetVectorID(X);
    printf("    Unrecognized vector type %d \n \n",(ulong)NVar1);
    X_local._4_4_ = 1;
  }
  return X_local._4_4_;
}

Assistant:

int Test_N_VGetVectorID(N_Vector X, N_Vector_ID ID, int myid)
{
  if (N_VGetVectorID(X) != ID) {
    printf(">>> FAILED test -- N_VGetVectorID, Proc %d \n", myid);
    printf("    Unrecognized vector type %d \n \n", N_VGetVectorID(X));
    return (1);
  } else if (myid == 0) {
    printf("PASSED test -- N_VGetVectorID \n");
  }
  return (0);
}